

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O0

vector<Transition_*,_std::allocator<Transition_*>_> * __thiscall
State::getTransitionsOnInput
          (vector<Transition_*,_std::allocator<Transition_*>_> *__return_storage_ptr__,State *this,
          char input,string *stack)

{
  bool bVar1;
  char cVar2;
  reference ppTVar3;
  __type local_aa;
  string local_80;
  Transition *local_50;
  Transition *transition;
  iterator __end1;
  iterator __begin1;
  vector<Transition_*,_std::allocator<Transition_*>_> *__range1;
  string *stack_local;
  char input_local;
  State *this_local;
  vector<Transition_*,_std::allocator<Transition_*>_> *transitions;
  
  std::vector<Transition_*,_std::allocator<Transition_*>_>::vector(__return_storage_ptr__);
  __end1 = std::vector<Transition_*,_std::allocator<Transition_*>_>::begin(&this->transitionsFrom);
  transition = (Transition *)
               std::vector<Transition_*,_std::allocator<Transition_*>_>::end(&this->transitionsFrom)
  ;
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Transition_**,_std::vector<Transition_*,_std::allocator<Transition_*>_>_>
                                     *)&transition), bVar1) {
    ppTVar3 = __gnu_cxx::
              __normal_iterator<Transition_**,_std::vector<Transition_*,_std::allocator<Transition_*>_>_>
              ::operator*(&__end1);
    local_50 = *ppTVar3;
    cVar2 = Transition::getInput(local_50);
    local_aa = false;
    if (cVar2 == input) {
      Transition::getStackInput_abi_cxx11_(&local_80,local_50);
      local_aa = std::operator==(&local_80,stack);
      std::__cxx11::string::~string((string *)&local_80);
    }
    if (local_aa != false) {
      std::vector<Transition*,std::allocator<Transition*>>::emplace_back<Transition*&>
                ((vector<Transition*,std::allocator<Transition*>> *)__return_storage_ptr__,&local_50
                );
    }
    __gnu_cxx::
    __normal_iterator<Transition_**,_std::vector<Transition_*,_std::allocator<Transition_*>_>_>::
    operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Transition *> State::getTransitionsOnInput(char input, std::string stack) {
    std::vector<Transition *> transitions;
    for (Transition *transition: transitionsFrom) {
        if (transition->getInput() == input && transition->getStackInput() == stack) {
            transitions.emplace_back(transition);
        }
    }
    return transitions;
}